

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O2

uint64_t pull_varint(uchar **cursor,size_t *max)

{
  size_t sVar1;
  uchar buf [9];
  uint64_t v;
  
  pull_bytes(buf,1,cursor,max);
  sVar1 = varint_length_from_bytes(buf);
  pull_bytes(buf + 1,sVar1 - 1,cursor,max);
  varint_from_bytes(buf,&v);
  return v;
}

Assistant:

uint64_t pull_varint(const unsigned char **cursor, size_t *max)
{
    unsigned char buf[sizeof(uint8_t) + sizeof(uint64_t)];
    uint64_t v;

    /* FIXME: Would be more efficient to opencode varint here! */
    pull_bytes(buf, 1, cursor, max);
    pull_bytes(buf + 1, varint_length_from_bytes(buf) - 1, cursor, max);
    varint_from_bytes(buf, &v);

    return v;
}